

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cxx
# Opt level: O0

void showTime(OledI2C *oled)

{
  int iVar1;
  int x;
  int iVar2;
  size_t sVar3;
  OledPoint OVar4;
  long *in_RDI;
  char date [12];
  OledPoint location;
  int offset;
  size_t length;
  char time [12];
  tm *tm;
  time_t now;
  OledPixel *in_stack_ffffffffffffffb0;
  PixelStyle in_stack_ffffffffffffffbc;
  PixelStyle style;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int in_stack_ffffffffffffffc4;
  PixelStyle PVar6;
  int in_stack_ffffffffffffffc8;
  int iVar7;
  char local_24 [12];
  tm *local_18;
  time_t local_10;
  long *local_8;
  
  local_8 = in_RDI;
  ::time(&local_10);
  local_18 = localtime(&local_10);
  sVar3 = strftime(local_24,0xc,"%l:%M:%S %P",local_18);
  iVar1 = (int)(sVar3 * -8 + 0x80 >> 1);
  SSD1306::Point<int>::Point((Point<int> *)&stack0xffffffffffffffc4,iVar1,0x12);
  OVar4 = SSD1306::drawString8x16
                    ((OledPoint *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  style = OVar4.m_x;
  iVar5 = OVar4.m_y;
  PVar6 = style;
  iVar1 = iVar5;
  sVar3 = strftime(&stack0xffffffffffffffb0,0xc,"%d %b %Y",local_18);
  x = (int)(sVar3 * -8 + 0x80 >> 1);
  iVar7 = x;
  iVar2 = SSD1306::Point<int>::y((Point<int> *)&stack0xffffffffffffffc4);
  SSD1306::Point<int>::set((Point<int> *)&stack0xffffffffffffffc4,x,iVar2 + 0x14);
  SSD1306::drawString8x8
            ((OledPoint *)CONCAT44(iVar7,iVar1),(char *)CONCAT44(PVar6,iVar5),style,
             in_stack_ffffffffffffffb0);
  (**(code **)(*local_8 + 0x38))();
  return;
}

Assistant:

void
showTime(
    SSD1306::OledI2C& oled)
{
    //---------------------------------------------------------------------

    time_t now;
    time(&now);
    struct tm* tm = localtime(&now);

    //---------------------------------------------------------------------

    static constexpr SSD1306::PixelStyle style{SSD1306::PixelStyle::Set};

    //---------------------------------------------------------------------

    char time[12];

    auto length = strftime(time, sizeof(time), "%l:%M:%S %P", tm);
    int offset = (128 - (8 * length)) / 2;

    SSD1306::OledPoint location{offset, 18};

    location = drawString8x16(location, time, style, oled);

    //---------------------------------------------------------------------

    char date[12];

    length = strftime(date, sizeof(date), "%d %b %Y", tm);
    offset = (128 - (8 * length)) / 2;

    location.set(offset, location.y() + 20);

    location = drawString8x8(location, date, style, oled);

    //---------------------------------------------------------------------

    oled.displayUpdate();
}